

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

void __thiscall
fasttext::Dictionary::Dictionary(Dictionary *this,shared_ptr<fasttext::Args> *args,istream *in)

{
  long in_RDI;
  istream *in_stack_00000038;
  shared_ptr<fasttext::Args> *in_stack_ffffffffffffffa8;
  shared_ptr<fasttext::Args> *in_stack_ffffffffffffffb0;
  
  std::shared_ptr<fasttext::Args>::shared_ptr(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x150045);
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::vector
            ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)0x150058);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x15006b);
  *(undefined4 *)(in_RDI + 0x58) = 0;
  *(undefined4 *)(in_RDI + 0x5c) = 0;
  *(undefined4 *)(in_RDI + 0x60) = 0;
  *(undefined8 *)(in_RDI + 0x68) = 0;
  *(undefined8 *)(in_RDI + 0x70) = 0;
  *(undefined8 *)(in_RDI + 0x78) = 0xffffffffffffffff;
  std::
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::unordered_map((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   *)0x1500ab);
  load((Dictionary *)in,in_stack_00000038);
  return;
}

Assistant:

Dictionary::Dictionary(std::shared_ptr<Args> args, std::istream& in)
		: args_(args),
			size_(0),
			nwords_(0),
			nlabels_(0),
			ntokens_(0),
			nids_(0),
			pruneidx_size_(-1) {
	load(in);
}